

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.cpp
# Opt level: O0

void vera::cullingMode(CullingMode _mode)

{
  CullingMode _mode_local;
  
  if (_mode == CULL_NONE) {
    glDisable(0xb44);
  }
  else {
    glEnable(0xb44);
    if (_mode == CULL_FRONT) {
      glCullFace(0x404);
    }
    else if (_mode == CULL_BACK) {
      glCullFace(0x405);
    }
    else if (_mode == CULL_BOTH) {
      glCullFace(0x408);
    }
  }
  return;
}

Assistant:

void cullingMode( CullingMode _mode ) {
    if (_mode == CULL_NONE) {
        glDisable(GL_CULL_FACE);
    }
    else {
        glEnable(GL_CULL_FACE);

        if (_mode == CULL_FRONT) 
            glCullFace(GL_FRONT);
        
        else if (_mode == CULL_BACK)
            glCullFace(GL_BACK);
        
        else if (_mode == CULL_BOTH)
            glCullFace(GL_FRONT_AND_BACK);
    }
}